

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

Token * __thiscall
qpdf::Tokenizer::readToken
          (Token *__return_storage_ptr__,Tokenizer *this,InputSource *input,string *context,
          bool allow_bad,size_t max_len)

{
  int iVar1;
  QPDFExc *this_00;
  undefined4 extraout_var;
  qpdf_offset_t qVar2;
  char char_to_unread;
  bool unread_char;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  nextToken(this,input,(string *)input,max_len);
  QPDFTokenizer::Token::Token(__return_storage_ptr__);
  getToken(this,__return_storage_ptr__,&unread_char,&char_to_unread);
  if (__return_storage_ptr__->type != tt_bad || allow_bad) {
    return __return_storage_ptr__;
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  iVar1 = (*input->_vptr_InputSource[3])(input);
  if (context->_M_string_length == 0) {
    qVar2 = InputSource::getLastOffset(input);
    std::__cxx11::to_string(&local_50,qVar2);
    std::operator+(&local_70,"offset ",&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)context);
  }
  qVar2 = InputSource::getLastOffset(input);
  QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,(string *)CONCAT44(extraout_var,iVar1),&local_70,qVar2
                   ,&__return_storage_ptr__->error_message);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFTokenizer::Token
Tokenizer::readToken(InputSource& input, std::string const& context, bool allow_bad, size_t max_len)
{
    nextToken(input, context, max_len);

    Token token;
    bool unread_char;
    char char_to_unread;
    getToken(token, unread_char, char_to_unread);

    if (token.getType() == tt::tt_bad) {
        if (allow_bad) {
            QTC::TC("qpdf", "QPDFTokenizer allowing bad token");
        } else {
            throw QPDFExc(
                qpdf_e_damaged_pdf,
                input.getName(),
                context.empty() ? "offset " + std::to_string(input.getLastOffset()) : context,
                input.getLastOffset(),
                token.getErrorMessage());
        }
    }
    return token;
}